

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffselect_table(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  int iVar1;
  int local_40;
  int local_3c;
  int hdunum;
  int ii;
  fitsfile *newptr;
  int *status_local;
  char *expr_local;
  char *outfile_local;
  fitsfile **fptr_local;
  
  newptr = (fitsfile *)status;
  status_local = (int *)expr;
  expr_local = outfile;
  outfile_local = (char *)fptr;
  if (*outfile == '\0') {
    _hdunum = *fptr;
  }
  else {
    iVar1 = ffinit((fitsfile **)&hdunum,outfile,status);
    if (0 < iVar1) {
      ffpmsg("failed to create file for selected rows from input table");
      ffpmsg(expr_local);
      return newptr->HDUposition;
    }
    ffghdn(*(fitsfile **)outfile_local,&local_40);
    if (*(int *)(*(long *)(*(long *)outfile_local + 8) + 0x1c) == 0) {
      for (local_3c = 1; local_3c < local_40; local_3c = local_3c + 1) {
        ffmahd(*(fitsfile **)outfile_local,local_3c,(int *)0x0,&newptr->HDUposition);
        iVar1 = ffcopy(*(fitsfile **)outfile_local,_hdunum,0,&newptr->HDUposition);
        if (0 < iVar1) {
          ffclos(_hdunum,&newptr->HDUposition);
          return newptr->HDUposition;
        }
      }
    }
    else {
      ffmahd(*(fitsfile **)outfile_local,1,(int *)0x0,&newptr->HDUposition);
      iVar1 = ffcopy(*(fitsfile **)outfile_local,_hdunum,0,&newptr->HDUposition);
      if (0 < iVar1) {
        ffclos(_hdunum,&newptr->HDUposition);
        return newptr->HDUposition;
      }
    }
    ffmahd(*(fitsfile **)outfile_local,local_40,(int *)0x0,&newptr->HDUposition);
    iVar1 = ffcphd(*(fitsfile **)outfile_local,_hdunum,&newptr->HDUposition);
    if (0 < iVar1) {
      ffclos(_hdunum,&newptr->HDUposition);
      return newptr->HDUposition;
    }
    ffmkyj(_hdunum,"NAXIS2",0,(char *)0x0,&newptr->HDUposition);
    _hdunum->Fptr->numrows = 0;
    _hdunum->Fptr->origrows = 0;
    iVar1 = ffrdef(_hdunum,&newptr->HDUposition);
    if (0 < iVar1) {
      ffclos(_hdunum,&newptr->HDUposition);
      return newptr->HDUposition;
    }
  }
  iVar1 = ffsrow(*(fitsfile **)outfile_local,_hdunum,(char *)status_local,&newptr->HDUposition);
  if (iVar1 < 1) {
    if (*expr_local != '\0') {
      iVar1 = local_40;
      if (*(int *)(*(long *)(*(long *)outfile_local + 8) + 0x1c) == 0) {
        while( true ) {
          local_3c = iVar1 + 1;
          iVar1 = ffmahd(*(fitsfile **)outfile_local,local_3c,(int *)0x0,&newptr->HDUposition);
          if (0 < iVar1) break;
          ffcopy(*(fitsfile **)outfile_local,_hdunum,0,&newptr->HDUposition);
          iVar1 = local_3c;
        }
        if (newptr->HDUposition == 0x6b) {
          newptr->HDUposition = 0;
        }
        else if (0 < newptr->HDUposition) {
          ffclos(_hdunum,&newptr->HDUposition);
          return newptr->HDUposition;
        }
      }
      else {
        local_40 = 2;
      }
      ffclos(*(fitsfile **)outfile_local,&newptr->HDUposition);
      *(fitsfile **)outfile_local = _hdunum;
      ffmahd(*(fitsfile **)outfile_local,local_40,(int *)0x0,&newptr->HDUposition);
    }
    fptr_local._4_4_ = newptr->HDUposition;
  }
  else {
    if (*expr_local != '\0') {
      ffclos(_hdunum,&newptr->HDUposition);
    }
    fptr_local._4_4_ = newptr->HDUposition;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffselect_table(
           fitsfile **fptr,  /* IO - pointer to input table; on output it  */
                             /*      points to the new selected rows table */
           char *outfile,    /* I - name for output file */
           char *expr,       /* I - Boolean expression    */
           int *status)
{
    fitsfile *newptr;
    int ii, hdunum;

    if (*outfile)
    {
      /* create new empty file in to hold the selected rows */
      if (ffinit(&newptr, outfile, status) > 0)
      {
        ffpmsg(
         "failed to create file for selected rows from input table");
        ffpmsg(outfile);
        return(*status);
      }

      fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

      /* copy all preceding extensions to the output file, if the 'only_one' flag is not set */
      if (!((*fptr)->Fptr)->only_one) {
        for (ii = 1; ii < hdunum; ii++)
        {
          fits_movabs_hdu(*fptr, ii, NULL, status);
          if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
          {
            ffclos(newptr, status);
            return(*status);
          }
        }
      } else {
          /* just copy the primary array */
          fits_movabs_hdu(*fptr, 1, NULL, status);
          if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
          {
            ffclos(newptr, status);
            return(*status);
          }
      }
      
      fits_movabs_hdu(*fptr, hdunum, NULL, status);

      /* copy all the header keywords from the input to output file */
      if (fits_copy_header(*fptr, newptr, status) > 0)
      {
        ffclos(newptr, status);
        return(*status);
      }

      /* set number of rows = 0 */
      fits_modify_key_lng(newptr, "NAXIS2", 0, NULL,status);
      (newptr->Fptr)->numrows = 0;
      (newptr->Fptr)->origrows = 0;

      if (ffrdef(newptr, status) > 0)  /* force the header to be scanned */
      {
        ffclos(newptr, status);
        return(*status);
      }
    }
    else
        newptr = *fptr;  /* will delete rows in place in the table */

    /* copy rows which satisfy the selection expression to the output table */
    /* or delete the nonqualifying rows if *fptr = newptr.   */
    if (fits_select_rows(*fptr, newptr, expr, status) > 0)
    {
        if (*outfile)
            ffclos(newptr, status);

        return(*status);
    }

    if (*outfile)
    {
      /* copy any remaining HDUs to the output copy */

      if (!((*fptr)->Fptr)->only_one) {
        for (ii = hdunum + 1; 1; ii++)
        {
          if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

          fits_copy_hdu(*fptr, newptr, 0, status);
        }

        if (*status == END_OF_FILE)   
          *status = 0;              /* got the expected EOF error; reset = 0  */
        else if (*status > 0)
        {
          ffclos(newptr, status);
          return(*status);
        }
      } else {
        hdunum = 2;
      }

      /* close the original file and return ptr to the new image */
      ffclos(*fptr, status);

      *fptr = newptr; /* reset the pointer to the new table */

      /* move back to the selected table HDU */
      fits_movabs_hdu(*fptr, hdunum, NULL, status);
    }

    return(*status);
}